

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O1

errr finish_parse_grafmode(parser *p)

{
  undefined8 *puVar1;
  char *pcVar2;
  graphics_mode *pgVar3;
  graphics_mode *pgVar4;
  errr extraout_EAX;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  wchar_t wVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  wVar8 = L'\0';
  if (p == (parser *)0x0) {
    uVar10 = 0;
  }
  else {
    plVar5 = (long *)parser_priv(p);
    uVar10 = 0;
    wVar8 = L'\0';
    if (plVar5 != (long *)0x0) {
      uVar10 = 0;
      wVar8 = L'\0';
      do {
        if ((uint)wVar8 <= (uint)*(byte *)(plVar5 + 1)) {
          wVar8 = (uint)*(byte *)(plVar5 + 1);
        }
        uVar10 = uVar10 + 1;
        plVar5 = (long *)*plVar5;
      } while (plVar5 != (long *)0x0);
    }
  }
  if (graphics_modes != (graphics_mode *)0x0) {
    mem_free(graphics_modes);
    graphics_modes = (graphics_mode *)0x0;
  }
  graphics_modes = (graphics_mode *)mem_zalloc((ulong)(uVar10 + 1) * 0x170);
  uVar6 = (ulong)uVar10;
  if ((p != (parser *)0x0) && (puVar7 = (undefined8 *)parser_priv(p), 0 < (int)uVar10)) {
    lVar11 = uVar6 * 0x170;
    lVar9 = uVar6 + 1;
    do {
      pgVar3 = graphics_modes;
      pcVar2 = graphics_modes->path;
      memcpy(pcVar2 + lVar11 + -0x10 + -0x170,puVar7,0x170);
      *(char **)(pgVar3[-1].path + lVar11 + -0x10) = pcVar2 + lVar11 + -0x10;
      puVar7 = (undefined8 *)*puVar7;
      lVar9 = lVar9 + -1;
      lVar11 = lVar11 + -0x170;
    } while (1 < lVar9);
  }
  graphics_modes[uVar6].pNext = (_graphics_mode *)0x0;
  pgVar3 = graphics_modes + uVar6;
  pgVar4 = graphics_modes + uVar6;
  pgVar4->grafID = '\0';
  pgVar4->alphablend = '\0';
  pgVar4->overdrawRow = '\0';
  pgVar4->overdrawMax = '\0';
  my_strcpy(pgVar3->pref,"none",8);
  my_strcpy(graphics_modes[uVar6].path,"",0x20);
  my_strcpy(graphics_modes[uVar6].file,"",0x20);
  my_strcpy(graphics_modes[uVar6].menuname,"None",0x20);
  current_graphics_mode = graphics_modes + uVar6;
  graphics_mode_high_id = wVar8;
  if (p != (parser *)0x0) {
    puVar7 = (undefined8 *)parser_priv(p);
    while (puVar7 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*puVar7;
      mem_free(puVar7);
      puVar7 = puVar1;
    }
    parser_setpriv(p,(void *)0x0);
    parser_destroy(p);
    return extraout_EAX;
  }
  return wVar8;
}

Assistant:

static errr finish_parse_grafmode(struct parser *p) {
	graphics_mode *mode, *n;
	int max = 0;
	int count = 0;
	int i;
	
	/* See how many graphics modes we have and what the highest index is */
	if (p) {
		mode = parser_priv(p);
		while (mode) {
			if (mode->grafID > max) {
				max = mode->grafID;
			}
			count++;
			mode = mode->pNext;
		}
	}

	/* Copy the loaded modes to the global variable */
	if (graphics_modes) {
		close_graphics_modes();
	}

	graphics_modes = mem_zalloc(sizeof(graphics_mode) * (count+1));
	if (p) {
		mode = parser_priv(p);
		for (i = count-1; i >= 0; i--, mode = mode->pNext) {
			memcpy(&(graphics_modes[i]), mode, sizeof(graphics_mode));
			graphics_modes[i].pNext = &(graphics_modes[i+1]);
		}
	}

	/* Hardcode the no graphics option */
	graphics_modes[count].pNext = NULL;
	graphics_modes[count].grafID = GRAPHICS_NONE;
	graphics_modes[count].alphablend = 0;
	graphics_modes[count].overdrawRow = 0;
	graphics_modes[count].overdrawMax = 0;
	my_strcpy(graphics_modes[count].pref, "none", 8);
	my_strcpy(graphics_modes[count].path, "", 32);
	my_strcpy(graphics_modes[count].file, "", 32);
	my_strcpy(graphics_modes[count].menuname, "None", 32);

	graphics_mode_high_id = max;

	/* Set the default graphics mode to be no graphics */
	current_graphics_mode = &(graphics_modes[count]);

	if (p) {
		mode = parser_priv(p);
		while (mode) {
			n = mode->pNext;
			mem_free(mode);
			mode = n;
		}
	
		parser_setpriv(p, NULL);
		parser_destroy(p);
	}
	return PARSE_ERROR_NONE;
}